

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_7x14(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *wsptr;
  DCTELEM *dataptr;
  DCTELEM workspace [48];
  INT32 z3;
  INT32 z2;
  INT32 z1;
  INT32 tmp16;
  INT32 tmp15;
  INT32 tmp14;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp6;
  INT32 tmp5;
  INT32 tmp4;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  int local_184;
  int *local_178;
  int *local_170;
  int local_168 [8];
  int local_148 [8];
  int local_128 [8];
  int local_108 [8];
  int local_e8 [8];
  int local_c8 [10];
  long local_a0;
  long local_98;
  long local_90;
  long local_68;
  long local_60;
  long local_58;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  uint local_14;
  long local_10;
  int *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(in_RDI,0,0x100);
  local_170 = local_8;
  local_184 = 0;
  while( true ) {
    while( true ) {
      pbVar1 = (byte *)(*(long *)(local_10 + (long)local_184 * 8) + (ulong)local_14);
      local_20 = (long)(int)((uint)*pbVar1 + (uint)pbVar1[6]);
      local_28 = (long)(int)((uint)pbVar1[1] + (uint)pbVar1[5]);
      local_30 = (long)(int)((uint)pbVar1[2] + (uint)pbVar1[4]);
      local_38 = (long)(int)(uint)pbVar1[3];
      local_58 = (long)(int)((uint)*pbVar1 - (uint)pbVar1[6]);
      local_60 = (long)(int)((uint)pbVar1[1] - (uint)pbVar1[5]);
      local_68 = (long)(int)((uint)pbVar1[2] - (uint)pbVar1[4]);
      local_90 = local_20 + local_30;
      *local_170 = ((int)local_90 + (uint)pbVar1[1] + (uint)pbVar1[5] + (uint)pbVar1[3] + -0x380) *
                   4;
      local_90 = (local_90 + local_38 * -4) * 0xb50;
      local_98 = (local_20 - local_30) * 0x1d76;
      local_a0 = (local_28 - local_30) * 0xa12;
      local_38 = local_38 * 2;
      local_170[2] = (int)(local_90 + local_98 + local_a0 + 0x400 >> 0xb);
      local_90 = local_90 - local_98;
      local_98 = (local_20 - local_28) * 0x1c37;
      local_170[4] = (int)(local_98 + local_a0 + (local_28 - local_38) * -0x16a1 + 0x400 >> 0xb);
      local_170[6] = (int)(local_90 + local_98 + 0x400 >> 0xb);
      lVar2 = (local_58 + local_60) * 0x1def;
      local_30 = (local_60 + local_68) * -0x2c1f;
      local_28 = local_30 + (local_58 - local_60) * 0x573 + lVar2;
      lVar3 = (local_58 + local_68) * 0x13a3;
      local_30 = lVar3 + local_68 * 0x3bde + local_30;
      local_170[1] = (int)(lVar3 + lVar2 + (local_58 - local_60) * -0x573 + 0x400 >> 0xb);
      local_170[3] = (int)(local_28 + 0x400 >> 0xb);
      local_170[5] = (int)(local_30 + 0x400 >> 0xb);
      local_184 = local_184 + 1;
      if (local_184 != 8) break;
      local_170 = local_168;
    }
    if (local_184 == 0xe) break;
    local_170 = local_170 + 8;
  }
  local_170 = local_8;
  local_178 = local_168;
  for (local_184 = 0; local_184 < 7; local_184 = local_184 + 1) {
    lVar2 = (long)(local_170[0x18] + local_178[0x10]);
    lVar3 = (long)(*local_170 + local_178[0x28]) + (long)(local_170[0x30] + local_170[0x38]);
    lVar4 = (long)(*local_170 + local_178[0x28]) - (long)(local_170[0x30] + local_170[0x38]);
    lVar5 = (long)(local_170[8] + local_178[0x20]) + (long)(local_170[0x28] + *local_178);
    lVar6 = (long)(local_170[8] + local_178[0x20]) - (long)(local_170[0x28] + *local_178);
    lVar7 = (long)(local_170[0x10] + local_178[0x18]) + (long)(local_170[0x20] + local_178[8]);
    lVar8 = (long)(local_170[0x10] + local_178[0x18]) - (long)(local_170[0x20] + local_178[8]);
    lVar9 = (long)(*local_170 - local_178[0x28]);
    lVar10 = (long)(local_170[8] - local_178[0x20]);
    lVar11 = (long)(local_170[0x10] - local_178[0x18]);
    lVar12 = (long)(local_170[0x18] - local_178[0x10]);
    lVar13 = (long)(local_170[0x20] - local_178[8]);
    lVar14 = (long)(local_170[0x28] - *local_178);
    lVar15 = (long)(local_170[0x30] - local_170[0x38]);
    *local_170 = (int)((lVar3 + lVar5 + lVar7 + lVar2) * 0x14e6 + 0x4000 >> 0xf);
    local_170[0x20] =
         (int)((lVar3 + lVar2 * -2) * 0x1aa1 + (lVar5 + lVar2 * -2) * 0x694 +
               (lVar7 + lVar2 * -2) * -0x126d + 0x4000 >> 0xf);
    lVar2 = (lVar4 + lVar6) * 0x171b;
    local_170[0x10] = (int)(lVar2 + lVar4 * 0x5b5 + lVar8 * 0xcd3 + 0x4000 >> 0xf);
    local_170[0x30] = (int)(lVar2 + lVar6 * -0x23ee + lVar8 * -0x1cd0 + 0x4000 >> 0xf);
    local_170[0x38] =
         (int)(((((lVar9 - (lVar10 + lVar11)) + lVar12) - (lVar14 - lVar13)) - lVar15) * 0x14e6 +
               0x4000 >> 0xf);
    lVar2 = (lVar14 - lVar13) * 0x1d5e + lVar12 * -0x14e6 + (lVar10 + lVar11) * -0x34f;
    lVar3 = (lVar9 + lVar11) * 0x1906 + (lVar13 + lVar15) * 0xfb9;
    local_170[0x28] = (int)(lVar2 + lVar3 + lVar11 * -0x319c + lVar13 * 0x1768 + 0x4000 >> 0xf);
    lVar4 = (lVar9 + lVar10) * 0x1be5 + (lVar14 - lVar15) * 0x9c3;
    local_170[0x18] = (int)(lVar2 + lVar4 + lVar10 * -0x8dd + lVar14 * -0x4027 + 0x4000 >> 0xf);
    local_170[8] = (int)(lVar3 + lVar4 + lVar12 * 0x14e6 + lVar9 * -0x178d + lVar15 * -0x2a7 +
                         0x4000 >> 0xf);
    local_170 = local_170 + 1;
    local_178 = local_178 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_7x14 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16;
  INT32 z1, z2, z3;
  DCTELEM workspace[8*6];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* 7-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/14). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[6]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[5]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[4]);
    tmp3 = GETJSAMPLE(elemptr[3]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[6]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[5]);
    tmp12 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[4]);

    z1 = tmp0 + tmp2;
    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((z1 + tmp1 + tmp3 - 7 * CENTERJSAMPLE) << PASS1_BITS);
    tmp3 += tmp3;
    z1 -= tmp3;
    z1 -= tmp3;
    z1 = MULTIPLY(z1, FIX(0.353553391));                /* (c2+c6-c4)/2 */
    z2 = MULTIPLY(tmp0 - tmp2, FIX(0.920609002));       /* (c2+c4-c6)/2 */
    z3 = MULTIPLY(tmp1 - tmp2, FIX(0.314692123));       /* c6 */
    dataptr[2] = (DCTELEM) DESCALE(z1 + z2 + z3, CONST_BITS-PASS1_BITS);
    z1 -= z2;
    z2 = MULTIPLY(tmp0 - tmp1, FIX(0.881747734));       /* c4 */
    dataptr[4] = (DCTELEM)
      DESCALE(z2 + z3 - MULTIPLY(tmp1 - tmp3, FIX(0.707106781)), /* c2+c6-c4 */
	      CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM) DESCALE(z1 + z2, CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(0.935414347));   /* (c3+c1-c5)/2 */
    tmp2 = MULTIPLY(tmp10 - tmp11, FIX(0.170262339));   /* (c3+c5-c1)/2 */
    tmp0 = tmp1 - tmp2;
    tmp1 += tmp2;
    tmp2 = MULTIPLY(tmp11 + tmp12, - FIX(1.378756276)); /* -c1 */
    tmp1 += tmp2;
    tmp3 = MULTIPLY(tmp10 + tmp12, FIX(0.613604268));   /* c5 */
    tmp0 += tmp3;
    tmp2 += tmp3 + MULTIPLY(tmp12, FIX(1.870828693));   /* c3+c1-c5 */

    dataptr[1] = (DCTELEM) DESCALE(tmp0, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp1, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp2, CONST_BITS-PASS1_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 14)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/7)*(8/14) = 32/49, which we
   * fold into the constant multipliers:
   * 14-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/28) * 32/49.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = 0; ctr < 7; ctr++) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*5];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*3];
    tmp13 = dataptr[DCTSIZE*3] + wsptr[DCTSIZE*2];
    tmp4 = dataptr[DCTSIZE*4] + wsptr[DCTSIZE*1];
    tmp5 = dataptr[DCTSIZE*5] + wsptr[DCTSIZE*0];
    tmp6 = dataptr[DCTSIZE*6] + dataptr[DCTSIZE*7];

    tmp10 = tmp0 + tmp6;
    tmp14 = tmp0 - tmp6;
    tmp11 = tmp1 + tmp5;
    tmp15 = tmp1 - tmp5;
    tmp12 = tmp2 + tmp4;
    tmp16 = tmp2 - tmp4;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*5];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*3];
    tmp3 = dataptr[DCTSIZE*3] - wsptr[DCTSIZE*2];
    tmp4 = dataptr[DCTSIZE*4] - wsptr[DCTSIZE*1];
    tmp5 = dataptr[DCTSIZE*5] - wsptr[DCTSIZE*0];
    tmp6 = dataptr[DCTSIZE*6] - dataptr[DCTSIZE*7];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11 + tmp12 + tmp13,
		       FIX(0.653061224)),                 /* 32/49 */
	      CONST_BITS+PASS1_BITS);
    tmp13 += tmp13;
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(0.832106052)) + /* c4 */
	      MULTIPLY(tmp11 - tmp13, FIX(0.205513223)) - /* c12 */
	      MULTIPLY(tmp12 - tmp13, FIX(0.575835255)),  /* c8 */
	      CONST_BITS+PASS1_BITS);

    tmp10 = MULTIPLY(tmp14 + tmp15, FIX(0.722074570));    /* c6 */

    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp14, FIX(0.178337691))   /* c2-c6 */
	      + MULTIPLY(tmp16, FIX(0.400721155)),        /* c10 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp15, FIX(1.122795725))   /* c6+c10 */
	      - MULTIPLY(tmp16, FIX(0.900412262)),        /* c2 */
	      CONST_BITS+PASS1_BITS);

    /* Odd part */

    tmp10 = tmp1 + tmp2;
    tmp11 = tmp5 - tmp4;
    dataptr[DCTSIZE*7] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp10 + tmp3 - tmp11 - tmp6,
		       FIX(0.653061224)),                 /* 32/49 */
	      CONST_BITS+PASS1_BITS);
    tmp3  = MULTIPLY(tmp3 , FIX(0.653061224));            /* 32/49 */
    tmp10 = MULTIPLY(tmp10, - FIX(0.103406812));          /* -c13 */
    tmp11 = MULTIPLY(tmp11, FIX(0.917760839));            /* c1 */
    tmp10 += tmp11 - tmp3;
    tmp11 = MULTIPLY(tmp0 + tmp2, FIX(0.782007410)) +     /* c5 */
	    MULTIPLY(tmp4 + tmp6, FIX(0.491367823));      /* c9 */
    dataptr[DCTSIZE*5] = (DCTELEM)
      DESCALE(tmp10 + tmp11 - MULTIPLY(tmp2, FIX(1.550341076)) /* c3+c5-c13 */
	      + MULTIPLY(tmp4, FIX(0.731428202)),         /* c1+c11-c9 */
	      CONST_BITS+PASS1_BITS);
    tmp12 = MULTIPLY(tmp0 + tmp1, FIX(0.871740478)) +     /* c3 */
	    MULTIPLY(tmp5 - tmp6, FIX(0.305035186));      /* c11 */
    dataptr[DCTSIZE*3] = (DCTELEM)
      DESCALE(tmp10 + tmp12 - MULTIPLY(tmp1, FIX(0.276965844)) /* c3-c9-c13 */
	      - MULTIPLY(tmp5, FIX(2.004803435)),         /* c1+c5+c11 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(tmp11 + tmp12 + tmp3
	      - MULTIPLY(tmp0, FIX(0.735987049))          /* c3+c5-c1 */
	      - MULTIPLY(tmp6, FIX(0.082925825)),         /* c9-c11-c13 */
	      CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}